

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O1

dictionary * dic_new(int initial_size)

{
  dictionary *pdVar1;
  keynode **ppkVar2;
  int iVar3;
  
  pdVar1 = (dictionary *)malloc(0x28);
  iVar3 = 0x400;
  if (initial_size != 0) {
    iVar3 = initial_size;
  }
  pdVar1->length = iVar3;
  pdVar1->count = 0;
  ppkVar2 = (keynode **)calloc(8,(long)iVar3);
  pdVar1->table = ppkVar2;
  pdVar1->growth_treshold = 2.0;
  pdVar1->growth_factor = 10.0;
  return pdVar1;
}

Assistant:

struct dictionary* dic_new(int initial_size) {
	struct dictionary* dic = malloc(sizeof(struct dictionary));
	if (initial_size == 0) initial_size = 1024;
	dic->length = initial_size;
	dic->count = 0;
	dic->table = calloc(sizeof(struct keynode*), initial_size);
	dic->growth_treshold = 2.0;
	dic->growth_factor = 10;
	return dic;
}